

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
mxx::impl::
split<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,impl *this,
          long begin,long *end,long param_5)

{
  int iVar1;
  pointer puVar2;
  unsigned_long uVar3;
  ulong uVar4;
  ulong uVar5;
  pointer puVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  size_type __n;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  pVar15;
  allocator_type local_61;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_60;
  long local_58;
  long local_50;
  long *local_48;
  impl *local_40;
  value_type_conflict2 local_38;
  
  __n = (size_type)*(int *)(param_5 + 0x10);
  local_60 = __return_storage_ptr__;
  local_58 = begin;
  local_48 = end;
  if (end[1] - *end >> 2 != __n - 1) {
    assert_fail("splitters.size() == (size_t)comm.size() - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
                ,0xe9,"split");
    __n = (size_type)*(int *)(param_5 + 0x10);
  }
  local_38 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (local_60,__n,&local_38,&local_61);
  uVar13 = local_58 - (long)this >> 2;
  iVar1 = *(int *)(param_5 + 0x10);
  uVar11 = 0;
  local_50 = param_5;
  while( true ) {
    lVar12 = *local_48;
    uVar7 = local_48[1] - lVar12 >> 2;
    if (uVar7 <= uVar11) break;
    uVar9 = 1;
    uVar14 = 2;
    while( true ) {
      uVar8 = ((int)uVar14 - 1) + uVar11;
      if ((uVar7 <= uVar8) || (*(int *)(lVar12 + uVar11 * 4) < *(int *)(lVar12 + uVar8 * 4))) break;
      uVar14 = (ulong)((int)uVar14 + 1);
      uVar9 = uVar9 + 1;
    }
    local_40 = this;
    pVar15 = std::
             __equal_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int,__gnu_cxx::__ops::_Iter_comp_val<std::less<int>>,__gnu_cxx::__ops::_Val_comp_iter<std::less<int>>>
                       (this,local_58);
    this = (impl *)pVar15.second._M_current;
    puVar2 = (local_60->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar6 = puVar2 + uVar11;
    uVar3 = ((long)pVar15.first._M_current._M_current - (long)local_40 >> 2) + *puVar6;
    *puVar6 = uVar3;
    uVar10 = (long)this - (long)pVar15.first._M_current >> 2;
    uVar7 = (uVar3 + uVar10) / uVar14 + 1;
    lVar12 = uVar11 << 0x20;
    for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
      uVar14 = puVar6[uVar11];
      uVar4 = uVar13 / (ulong)(long)iVar1 +
              (ulong)((ulong)(lVar12 >> 0x20) < uVar13 % (ulong)(long)iVar1);
      uVar5 = uVar4 - uVar14;
      if (uVar4 < uVar14 || uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        if (uVar5 <= uVar7) {
          uVar5 = uVar7;
        }
        if (uVar10 < uVar5) {
          uVar5 = uVar10;
        }
        uVar10 = uVar10 - uVar5;
      }
      puVar6[uVar11] = uVar5 + uVar14;
      lVar12 = lVar12 + 0x100000000;
    }
    puVar2 = puVar2 + uVar8;
    *puVar2 = *puVar2 + uVar10;
    uVar11 = uVar8;
  }
  puVar6 = (local_60->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6[(long)*(int *)(local_50 + 0x10) + -1] =
       puVar6[(long)*(int *)(local_50 + 0x10) + -1] + (local_58 - (long)this >> 2);
  uVar11 = 0;
  for (; puVar6 != (local_60->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish; puVar6 = puVar6 + 1) {
    uVar11 = uVar11 + *puVar6;
  }
  if (uVar11 != uVar13) {
    assert_fail("std::accumulate(send_counts.begin(), send_counts.end(), 0ull) == local_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
                ,0x114,"split");
  }
  return local_60;
}

Assistant:

std::vector<size_t> split(_Iterator begin, _Iterator end, _Compare comp, const std::vector<typename std::iterator_traits<_Iterator>::value_type>& splitters, const mxx::comm& comm) {
    // 5. locally find splitter positions in data
    //    (if an identical splitter appears at least three times (or more),
    //    then split the intermediary buckets evenly) => send_counts
    MXX_ASSERT(splitters.size() == (size_t)comm.size() - 1);
    std::vector<size_t> send_counts(comm.size(), 0);
    _Iterator pos = begin;
    size_t local_size = std::distance(begin, end);
    partition::block_decomposition<std::size_t> local_part(local_size, comm.size(), comm.rank());
    for (std::size_t i = 0; i < splitters.size();) {
        // get the number of splitters which are equal starting from `i`
        unsigned int split_by = 1;
        while (i+split_by < splitters.size()
               && !comp(splitters[i], splitters[i+split_by])) {
            ++split_by;
        }

        // get the range of equal elements
        std::pair<_Iterator, _Iterator> eqr = std::equal_range(pos, end, splitters[i], comp);

        // assign smaller elements to processor left of splitter (= `i`)
        send_counts[i] += std::distance(pos, eqr.first);
        pos = eqr.first;

        // split equal elements fairly across processors
        std::size_t eq_size = std::distance(pos, eqr.second);
        // try to split approx equal:
        std::size_t eq_size_split = (eq_size + send_counts[i]) / (split_by+1) + 1;
        for (unsigned int j = 0; j < split_by; ++j) {
            // TODO: this kind of splitting is not `stable` (need other strategy
            // to mak such splitting stable across processors)
            std::size_t out_size = 0;
            if (send_counts[i+j] < local_part.local_size(i+j)) {
                // try to distribute fairly
                out_size = std::min(std::max(local_part.local_size(i+j) - send_counts[i+j], eq_size_split), eq_size);
                eq_size -= out_size;
            }
            send_counts[i+j] += out_size;
        }
        // assign remaining elements to next processor
        send_counts[i+split_by] += eq_size;
        i += split_by;
        pos = eqr.second;
    }
    // send last elements to last processor
    std::size_t out_size = std::distance(pos, end);
    send_counts[comm.size() - 1] += out_size;
    MXX_ASSERT(std::accumulate(send_counts.begin(), send_counts.end(), 0ull) == local_size);
    return send_counts;
}